

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Stress::anon_unknown_0::BlendingCase::drawTestImage
          (BlendingCase *this,PixelBufferAccess *dst,GLuint uColorLoc,int maxVertexIndex)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar4;
  deUint16 indices [3];
  Vec4 color;
  Random rnd;
  long lVar3;
  
  iVar1 = (*((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  deRandom_init(&rnd.m_rnd,0x7b);
  (**(code **)(lVar3 + 0x188))(0x4000);
  (**(code **)(lVar3 + 0x100))(0x8006);
  (**(code **)(lVar3 + 0x120))();
  iVar1 = 0x14;
  while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
    tcu::Vector<float,_4>::Vector(&color);
    color.m_data[0] = deRandom_getFloat(&rnd.m_rnd);
    color.m_data[1] = deRandom_getFloat(&rnd.m_rnd);
    color.m_data[2] = deRandom_getFloat(&rnd.m_rnd);
    color.m_data[3] = deRandom_getFloat(&rnd.m_rnd);
    (**(code **)(lVar3 + 0x15a8))(uColorLoc,1,&color);
    iVar2 = de::Random::getInt((Random *)&rnd.m_rnd,0,maxVertexIndex);
    indices[0] = (deUint16)iVar2;
    iVar2 = de::Random::getInt((Random *)&rnd.m_rnd,0,maxVertexIndex);
    indices[1] = (deUint16)iVar2;
    iVar2 = de::Random::getInt((Random *)&rnd.m_rnd,0,maxVertexIndex);
    indices[2] = (deUint16)iVar2;
    (**(code **)(lVar3 + 0x568))(4,3,0x1403,indices);
  }
  (**(code **)(lVar3 + 0x648))();
  glu::readPixels(((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)->
                  m_renderCtx,0,0,dst);
  return;
}

Assistant:

void BlendingCase::drawTestImage (tcu::PixelBufferAccess dst, GLuint uColorLoc, int maxVertexIndex)
{
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();
	de::Random				rnd	(123);

	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.blendEquation(GL_FUNC_ADD);
	gl.blendFunc(GL_ONE, GL_ONE);

	for (int tri = 0; tri < 20; ++tri)
	{
		tcu::Vec4 color;
		color.x() = rnd.getFloat();
		color.y() = rnd.getFloat();
		color.z() = rnd.getFloat();
		color.w() = rnd.getFloat();
		gl.uniform4fv(uColorLoc, 1, color.getPtr());

		deUint16 indices[3];
		indices[0] = (deUint16)rnd.getInt(0, maxVertexIndex);
		indices[1] = (deUint16)rnd.getInt(0, maxVertexIndex);
		indices[2] = (deUint16)rnd.getInt(0, maxVertexIndex);

		gl.drawElements(GL_TRIANGLES, 3, GL_UNSIGNED_SHORT, indices);
	}

	gl.finish();
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst);
}